

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng::save_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  ofstream file;
  long local_210;
  filebuf local_208 [24];
  byte abStack_1f0 [216];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,(filename->_M_dataplus)._M_p,_S_out|_S_bin);
  uVar2 = 0x4f;
  if ((abStack_1f0[*(long *)(local_210 + -0x18)] & 5) == 0) {
    puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = 0;
    puVar3 = (pointer)0x0;
    if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      puVar3 = puVar1;
    }
    std::ostream::write((char *)&local_210,(long)puVar3);
  }
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _XSetInputFocus;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return uVar2;
}

Assistant:

unsigned save_file(const std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ofstream file(filename.c_str(), std::ios::out|std::ios::binary);
  if(!file) return 79;
  file.write(buffer.empty() ? 0 : (char*)&buffer[0], std::streamsize(buffer.size()));
  return 0;
}